

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::~LocationRecorder(LocationRecorder *this)

{
  int iVar1;
  
  iVar1 = protobuf::internal::SooRep::size
                    (&(this->location_->field_0)._impl_.span_.soo_rep_,
                     (*(byte *)((long)&this->location_->field_0 + 0x20) & 4) == 0);
  if (iVar1 < 3) {
    EndAt(this,&this->parser_->input_->previous_);
  }
  return;
}

Assistant:

Parser::LocationRecorder::~LocationRecorder() {
  if (location_->span_size() <= 2) {
    EndAt(parser_->input_->previous());
  }
}